

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::setForegroundBrush(QGraphicsView *this,QBrush *brush)

{
  long lVar1;
  QRegionData *pQVar2;
  long in_FS_OFFSET;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  QBrush::operator=((QBrush *)(lVar1 + 0x4e8),brush);
  QWidget::update(*(QWidget **)(lVar1 + 0x2b0));
  *(byte *)(lVar1 + 0x301) = *(byte *)(lVar1 + 0x301) | 0x10;
  *(undefined8 *)(lVar1 + 0x530) = 0;
  *(undefined8 *)(lVar1 + 0x538) = 0xffffffffffffffff;
  QRegion::QRegion(&local_20);
  pQVar2 = *(QRegionData **)(lVar1 + 0x528);
  *(QRegionData **)(lVar1 + 0x528) = local_20.d;
  local_20.d = pQVar2;
  QRegion::~QRegion(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::setForegroundBrush(const QBrush &brush)
{
    Q_D(QGraphicsView);
    d->foregroundBrush = brush;
    d->updateAll();
}